

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O3

keyvalue * hash_search(hashmap *hash,char *name)

{
  keyvalue *pkVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = *(uint *)(name + 0xc) ^ *(uint *)(name + 4) ^ *(uint *)(name + 8) ^ *(uint *)name;
  pkVar1 = hash->node[uVar3 & 0xfff];
  while( true ) {
    if (pkVar1 == (keyvalue *)0x0) {
      return (keyvalue *)0x0;
    }
    if ((pkVar1->hash == uVar3) && (iVar2 = strncmp(pkVar1->key,name,0x10), iVar2 == 0)) break;
    pkVar1 = pkVar1->next;
  }
  return pkVar1;
}

Assistant:

static struct keyvalue *
hash_search(struct hashmap * hash, const char name[GLOBALNAME_LENGTH]) {
	uint32_t *ptr = (uint32_t*) name;
	uint32_t h = ptr[0] ^ ptr[1] ^ ptr[2] ^ ptr[3];
	struct keyvalue * node = hash->node[h % HASH_SIZE];
	while (node) {
		if (node->hash == h && strncmp(node->key, name, GLOBALNAME_LENGTH) == 0) {
			return node;
		}
		node = node->next;
	}
	return NULL;
}